

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

int emit_op_newarray(Function *fn,Instruction *insn)

{
  TextBuffer *mb;
  int extraout_EAX;
  Pseudo *pseudo;
  char *pcVar1;
  
  pseudo = get_first_target(insn);
  mb = &fn->body;
  raviX_buffer_add_string(mb,"{\n");
  raviX_buffer_add_string(mb," TValue *ra = ");
  emit_reg_accessor(fn,pseudo,0);
  pcVar1 = "raviV_op_newarrayint";
  if (*(char *)insn == '=') {
    pcVar1 = "raviV_op_newarrayfloat";
  }
  raviX_buffer_add_fstring(mb,";\n %s(L, ci, ra);\n",pcVar1);
  emit_reload_base(fn);
  raviX_buffer_add_string(mb,"}\n");
  return extraout_EAX;
}

Assistant:

static int emit_op_newarray(Function *fn, Instruction *insn)
{
	Pseudo *target_pseudo = get_first_target(insn);
	raviX_buffer_add_string(&fn->body, "{\n");
	raviX_buffer_add_string(&fn->body, " TValue *ra = ");
	emit_reg_accessor(fn, target_pseudo, 0);
	raviX_buffer_add_fstring(&fn->body, ";\n %s(L, ci, ra);\n",
				 insn->opcode == op_newfarray ? "raviV_op_newarrayfloat" : "raviV_op_newarrayint");
	emit_reload_base(fn);
	raviX_buffer_add_string(&fn->body, "}\n");
	return 0;
}